

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O3

void collect_mv_stats_sb(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  MB_MODE_INFO **ppMVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  iVar11 = (cpi->common).mi_params.mi_rows;
  if (iVar11 <= mi_row) {
switchD_001e1f5c_caseD_3:
    return;
  }
LAB_001e1ccc:
  iVar6 = (cpi->common).mi_params.mi_cols;
  if (iVar6 <= mi_col) {
    return;
  }
  if (iVar11 <= mi_row) {
    return;
  }
  iVar7 = (cpi->common).mi_params.mi_stride;
  ppMVar8 = (cpi->common).mi_params.mi_grid_base;
  lVar14 = (long)(iVar7 * mi_row + mi_col);
  BVar1 = ppMVar8[lVar14]->bsize;
  uVar9 = (ulong)bsize;
  if (BVar1 == bsize) {
    bVar10 = 0;
  }
  else {
    bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar9];
    bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar9];
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
    bVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
    if (BLOCK_8X8 < bsize) {
      if ((int)((uint)(bVar2 >> 1) + mi_row) < iVar11) {
        if ((int)((uint)(bVar5 >> 1) + mi_col) < iVar6) {
          if (bVar4 == bVar2) {
            bVar10 = 8;
            if ((uint)bVar3 << 2 != (uint)bVar5) {
              bVar10 = (ppMVar8[lVar14 + (int)((uint)(bVar5 >> 1) * iVar7)]->bsize != BVar1) *
                       '\x04' + 1;
            }
          }
          else if (bVar3 == bVar5) {
            bVar10 = 9;
            if ((uint)bVar4 << 2 != (uint)bVar2) {
              bVar10 = (ppMVar8[lVar14 + (ulong)(uint)(bVar2 >> 1)]->bsize != BVar1) * '\x05' + 2;
            }
          }
          else {
            bVar10 = 3;
            if ((((uint)bVar4 * 2 == (uint)bVar2) && ((uint)bVar3 * 2 == (uint)bVar5)) &&
               (bVar10 = 4,
               "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [ppMVar8[lVar14 + (int)((uint)(bVar5 >> 1) * iVar7)]->bsize] != bVar2)) {
              bVar10 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [ppMVar8[lVar14 + (ulong)(uint)(bVar2 >> 1)]->bsize] == bVar5) * '\x03' + 3;
            }
          }
          goto LAB_001e1dbf;
        }
      }
    }
    lVar14 = (ulong)(bVar3 < bVar5) + (ulong)(bVar4 < bVar2) * 2;
    if (lVar14 == 0) {
      return;
    }
    bVar10 = *(byte *)((long)&get_partition_base_partitions + lVar14);
  }
LAB_001e1dbf:
  BVar1 = BLOCK_INVALID;
  switch(uVar9) {
  case 0:
    uVar12 = uVar9;
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_001e1dde_caseD_1;
  case 3:
    uVar12 = 1;
    break;
  case 6:
    uVar12 = 2;
    break;
  case 9:
    uVar12 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar12 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001e1dde_caseD_1;
      uVar12 = 5;
    }
  }
  BVar1 = subsize_lookup[bVar10][uVar12];
switchD_001e1dde_caseD_1:
  bsize = BVar1;
  bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar9];
  uVar13 = (uint)(bVar5 >> 1);
  if (bVar10 == 3) goto code_r0x001e1e47;
  switch(bVar10) {
  case 0:
    goto LAB_001e2095;
  case 1:
    iVar11 = mi_col;
    break;
  case 2:
    iVar11 = mi_row;
    goto LAB_001e1fea;
  default:
    goto switchD_001e1f5c_caseD_3;
  case 4:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    iVar11 = mi_col + uVar13;
    break;
  case 5:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    mi_row = mi_row + uVar13;
    iVar11 = mi_row;
    goto LAB_001e1fea;
  case 6:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    iVar11 = mi_row + uVar13;
LAB_001e1fea:
    collect_mv_stats_b(mv_stats,cpi,iVar11,mi_col);
    mi_col = uVar13 + mi_col;
    goto LAB_001e2095;
  case 7:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    mi_col = mi_col + uVar13;
    iVar11 = mi_col;
    break;
  case 8:
    iVar11 = 4;
    do {
      collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
      mi_row = mi_row + (uint)(bVar5 >> 2);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    return;
  case 9:
    iVar11 = 4;
    do {
      collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
      mi_col = mi_col + (uint)(bVar5 >> 2);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    goto switchD_001e1f5c_caseD_3;
  }
  collect_mv_stats_b(mv_stats,cpi,mi_row,iVar11);
  mi_row = uVar13 + mi_row;
LAB_001e2095:
  collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
  return;
code_r0x001e1e47:
  collect_mv_stats_sb(mv_stats,cpi,mi_row,mi_col,bsize);
  collect_mv_stats_sb(mv_stats,cpi,mi_row,mi_col + uVar13,bsize);
  mi_row = uVar13 + mi_row;
  collect_mv_stats_sb(mv_stats,cpi,mi_row,mi_col,bsize);
  iVar11 = (cpi->common).mi_params.mi_rows;
  mi_col = mi_col + uVar13;
  if (iVar11 <= mi_row) {
    return;
  }
  goto LAB_001e1ccc;
}

Assistant:

static inline void collect_mv_stats_sb(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                       int mi_row, int mi_col,
                                       BLOCK_SIZE bsize) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *cm = &cpi->common;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  const int hbs = mi_size_wide[bsize] / 2;
  const int qbs = mi_size_wide[bsize] / 4;
  switch (partition) {
    case PARTITION_NONE:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col + hbs, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row + hbs, mi_col, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        const int this_mi_row = mi_row + i * qbs;
        collect_mv_stats_b(mv_stats, cpi, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        const int this_mi_col = mi_col + i * qbs;
        collect_mv_stats_b(mv_stats, cpi, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }
}